

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O1

void __thiscall wasm::CoalesceLocals::calculateInterferences(CoalesceLocals *this)

{
  ulong *puVar1;
  uint uVar2;
  Function *this_00;
  BasicBlock *pBVar3;
  uint *puVar4;
  Expression *expr;
  uint32_t i_00;
  pointer puVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  Index IVar9;
  size_type sVar10;
  pointer pLVar11;
  size_t sVar12;
  Type type;
  size_t sVar13;
  ulong uVar14;
  uint j_00;
  Index i;
  __node_base_ptr p_Var15;
  uint *puVar16;
  ulong uVar17;
  Index j;
  long lVar18;
  iterator __begin3;
  uint uVar19;
  long lVar20;
  Literals local_180;
  undefined1 local_148 [8];
  ValueNumbering valueNumbering;
  undefined1 local_a8 [8];
  vector<bool,_std::allocator<bool>_> endsLiveRange;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  Type local_60;
  BasicBlock *local_58;
  undefined1 local_50 [8];
  SetOfLocals live;
  
  sparse_square_matrix<bool>::recreate
            (&this->interferences,
             (this->
             super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
             ).
             super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             numLocals);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage,
             (ulong)(this->
                    super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                    ).
                    super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                    .numLocals,(allocator_type *)local_148);
  local_148._0_4_ = 0;
  valueNumbering._0_8_ = &valueNumbering.literalValues._M_h._M_rehash_policy._M_next_resize;
  valueNumbering.literalValues._M_h._M_buckets = (__buckets_ptr)0x1;
  valueNumbering.literalValues._M_h._M_bucket_count = 0;
  valueNumbering.literalValues._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  valueNumbering.literalValues._M_h._M_element_count._0_4_ = 0x3f800000;
  valueNumbering.literalValues._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  valueNumbering.literalValues._M_h._M_rehash_policy._4_4_ = 0;
  valueNumbering.literalValues._M_h._M_rehash_policy._M_next_resize = 0;
  valueNumbering.literalValues._M_h._M_single_bucket =
       (__node_base_ptr)&valueNumbering.expressionValues._M_h._M_rehash_policy._M_next_resize;
  valueNumbering.expressionValues._M_h._M_buckets = (__buckets_ptr)0x1;
  valueNumbering.expressionValues._M_h._M_bucket_count = 0;
  valueNumbering.expressionValues._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  valueNumbering.expressionValues._M_h._M_element_count._0_4_ = 0x3f800000;
  valueNumbering.expressionValues._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  valueNumbering.expressionValues._M_h._M_rehash_policy._4_4_ = 0;
  valueNumbering.expressionValues._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var15 = (__node_base_ptr)
            (this->
            super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
            ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
            .
            super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
            .basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  valueNumbering.expressionValues._M_h._M_single_bucket =
       *(__node_base_ptr *)
        ((long)&(this->
                super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                ).
                super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                .
                super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                .basicBlocks.
                super__Vector_base<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data + 8);
  live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  if (p_Var15 != valueNumbering.expressionValues._M_h._M_single_bucket) {
    this_00 = (this->
              super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
              ).
              super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
              .
              super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
              .super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
              super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
              currFunction;
    do {
      local_a8 = (undefined1  [8])
                 (((__uniq_ptr_data<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>,_true,_true>
                    *)&p_Var15->_M_nxt)->
                 super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 )._M_t.
                 super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 .
                 super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                 ._M_head_impl;
      sVar10 = std::
               _Hashtable<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&(this->
                        super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                        ).
                        super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                        .liveBlocks._M_h,(key_type *)local_a8);
      if (sVar10 != 0) {
        local_58 = (((__uniq_ptr_data<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>,_true,_true>
                      *)&p_Var15->_M_nxt)->
                   super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                   )._M_t.
                   super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                   .
                   super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                   ._M_head_impl;
        local_50[0] = 0;
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)local_a8,
                   ((long)*(pointer *)((long)&(local_58->contents).actions + 8) -
                    *(long *)&(local_58->contents).actions.
                              super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                              ._M_impl >> 3) * -0x5555555555555555,(bool *)local_50,
                   (allocator_type *)&local_60);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                   &(((((__uniq_ptr_data<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>,_true,_true>
                         *)&p_Var15->_M_nxt)->
                      super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                      )._M_t.
                      super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                      .
                      super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                     ._M_head_impl)->contents).end.
                    super_vector<unsigned_int,_std::allocator<unsigned_int>_>);
        uVar19 = (int)((long)*(pointer *)
                              ((long)&(local_58->contents).actions.
                                      super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                                      ._M_impl + 8) -
                       (long)(local_58->contents).actions.
                             super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
        if (0 < (int)uVar19) {
          uVar17 = (ulong)(uVar19 & 0x7fffffff);
          lVar20 = uVar17 + 1;
          lVar18 = uVar17 * 0x18 + -8;
          do {
            pLVar11 = (local_58->contents).actions.
                      super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            IVar9 = *(Index *)((long)pLVar11 + lVar18 + -0xc);
            if (*(int *)((long)pLVar11 + lVar18 + -0x10) == 0) {
              bVar7 = SortedVector::has((SortedVector *)local_50,IVar9);
              if (!bVar7) {
                puVar1 = (ulong *)((long)&(((Liveness *)local_a8)->start).
                                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (lVar20 - 2U >> 6) * 8);
                *puVar1 = *puVar1 | 1L << ((byte)(lVar20 - 2U) & 0x3f);
                SortedVector::insert((SortedVector *)local_50,IVar9);
              }
            }
            else {
              bVar7 = SortedVector::erase((SortedVector *)local_50,IVar9);
              if (bVar7) {
                *(undefined1 *)((long)&pLVar11->what + lVar18) = 1;
              }
            }
            lVar20 = lVar20 + -1;
            lVar18 = lVar18 + -0x18;
          } while (1 < lVar20);
        }
        pBVar3 = (((__uniq_ptr_data<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>,_true,_true>
                    *)&p_Var15->_M_nxt)->
                 super___uniq_ptr_impl<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 )._M_t.
                 super__Tuple_impl<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock>_>
                 .
                 super__Head_base<0UL,_wasm::CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::BasicBlock_*,_false>
                 ._M_head_impl;
        puVar5 = (pointer)CONCAT71(local_50._1_7_,local_50[0]);
        puVar16 = *(uint **)&(pBVar3->contents).start;
        puVar4 = *(pointer *)((long)&(pBVar3->contents).start + 8);
        if (((long)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)puVar5 != (long)puVar4 - (long)puVar16)
           || ((live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != puVar5 &&
               (iVar8 = bcmp(puVar5,puVar16,
                             (long)live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start - (long)puVar5),
               iVar8 != 0)))) {
          __assert_fail("live == curr->contents.start",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                        ,0xca,"void wasm::CoalesceLocals::calculateInterferences()");
        }
        if (pBVar3 == *(BasicBlock **)
                       (live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 0x4c)) {
          for (uVar17 = 0; sVar13 = Function::getNumParams(this_00), uVar17 < sVar13;
              uVar17 = (ulong)((int)uVar17 + 1)) {
            *(undefined4 *)
             ((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage + uVar17 * 4) = local_148._0_4_;
            local_148._0_4_ = local_148._0_4_ + 1;
          }
          sVar13 = Function::getNumParams(this_00);
          while( true ) {
            sVar12 = Function::getNumLocals(this_00);
            uVar17 = sVar13 & 0xffffffff;
            if (sVar12 <= uVar17) break;
            type = Function::getLocalType(this_00,(Index)sVar13);
            local_60 = type;
            bVar7 = wasm::Type::isDefaultable(&local_60);
            if (bVar7) {
              Literal::makeZeros(&local_180,type);
              IVar9 = ValueNumbering::getValue((ValueNumbering *)local_148,&local_180);
              *(Index *)((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage + uVar17 * 4) = IVar9;
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                        (&local_180.super_SmallVector<wasm::Literal,_1UL>.flexible);
              Literal::~Literal(local_180.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
            }
            else {
              *(undefined4 *)
               ((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage + uVar17 * 4) = local_148._0_4_;
              local_148._0_4_ = local_148._0_4_ + 1;
            }
            sVar13 = (size_t)((Index)sVar13 + 1);
          }
        }
        else {
          for (; puVar16 != puVar4; puVar16 = puVar16 + 1) {
            *(undefined4 *)
             ((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage + (ulong)*puVar16 * 4) =
                 local_148._0_4_;
            local_148._0_4_ = local_148._0_4_ + 1;
          }
        }
        pLVar11 = (local_58->contents).actions.
                  super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((local_58->contents).actions.
            super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>._M_impl.
            super__Vector_impl_data._M_finish != pLVar11) {
          uVar17 = 0;
          do {
            uVar19 = pLVar11[uVar17].index;
            iVar8 = (int)uVar17;
            if (pLVar11[uVar17].what == Get) {
              if (((*(ulong *)((long)&(((Liveness *)local_a8)->start).
                                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (uVar17 >> 6) * 8)
                    >> (uVar17 & 0x3f) & 1) != 0) &&
                 (bVar7 = SortedVector::erase((SortedVector *)local_50,uVar19), !bVar7)) {
                __assert_fail("erased",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                              ,0xf8,"void wasm::CoalesceLocals::calculateInterferences()");
              }
            }
            else {
              if ((*pLVar11[uVar17].origin)->_id != LocalSetId) {
                __assert_fail("int(_id) == int(T::SpecificId)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                              ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
              }
              expr = (Expression *)(*pLVar11[uVar17].origin)[1].type.id;
              if ((expr->_id & ~BlockId) == LocalGetId) {
                if ((iVar8 == 0) || (expr != *pLVar11[iVar8 - 1U].origin)) {
                  __assert_fail("i > 0 && set->value == *actions[i - 1].origin",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                                ,0x103,"void wasm::CoalesceLocals::calculateInterferences()");
                }
                IVar9 = *(Index *)((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_end_of_storage +
                                  (ulong)pLVar11[iVar8 - 1U].index * 4);
              }
              else {
                IVar9 = ValueNumbering::getValue((ValueNumbering *)local_148,expr);
              }
              puVar5 = live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *(Index *)((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage + (ulong)uVar19 * 4) =
                   IVar9;
              if (pLVar11[uVar17].effective == true) {
                for (puVar16 = (uint *)CONCAT71(local_50._1_7_,local_50[0]); puVar16 != puVar5;
                    puVar16 = puVar16 + 1) {
                  uVar2 = *puVar16;
                  if (uVar2 == uVar19) {
                    __assert_fail("other != index",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                                  ,0x118,"void wasm::CoalesceLocals::calculateInterferences()");
                  }
                  if (*(Index *)((long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_end_of_storage +
                                (ulong)uVar2 * 4) != IVar9) {
                    j_00 = uVar2;
                    i_00 = uVar19;
                    if (uVar2 <= uVar19) {
                      j_00 = uVar19;
                      i_00 = uVar2;
                    }
                    local_60.id._0_1_ = 1;
                    sparse_square_matrix<bool>::set
                              (&this->interferences,i_00,j_00,(bool *)&local_60);
                  }
                }
                SortedVector::insert((SortedVector *)local_50,pLVar11[uVar17].index);
              }
            }
            uVar17 = (ulong)(iVar8 + 1);
            pLVar11 = (local_58->contents).actions.
                      super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar14 = ((long)(local_58->contents).actions.
                            super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar11 >> 3) *
                     -0x5555555555555555;
          } while (uVar17 <= uVar14 && uVar14 - uVar17 != 0);
        }
        pvVar6 = (void *)CONCAT71(local_50._1_7_,local_50[0]);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,(long)live.
                                       super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6);
        }
        if (local_a8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_a8,
                          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ -
                          (long)local_a8);
          local_a8 = (undefined1  [8])0x0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._12_4_ = 0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p._0_4_ = 0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._12_4_ = 0;
        }
      }
      p_Var15 = p_Var15 + 1;
    } while (p_Var15 != valueNumbering.expressionValues._M_h._M_single_bucket);
  }
  sVar13 = Function::getNumParams
                     (*(Function **)
                       (live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 0x48));
  if (sVar13 != 0) {
    uVar17 = 0;
    do {
      IVar9 = (Index)uVar17;
      uVar17 = (ulong)(IVar9 + 1);
      for (uVar14 = uVar17; uVar14 < sVar13; uVar14 = (ulong)((Index)uVar14 + 1)) {
        interfereLowHigh((CoalesceLocals *)
                         live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,IVar9,(Index)uVar14);
      }
    } while (uVar17 < sVar13);
  }
  puVar16 = (uint *)**(undefined8 **)
                      (live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x4c);
  puVar4 = (uint *)(*(undefined8 **)
                     (live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 0x4c))[1];
  if (puVar16 != puVar4) {
    do {
      uVar19 = *puVar16;
      if (sVar13 - 1 < (ulong)uVar19) {
        uVar17 = 0;
        do {
          interfereLowHigh((CoalesceLocals *)
                           live.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(Index)uVar17,uVar19);
          uVar17 = (ulong)((Index)uVar17 + 1);
        } while (uVar17 < sVar13);
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar4);
  }
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&valueNumbering.literalValues._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Literals,_std::pair<const_wasm::Literals,_unsigned_int>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literals>,_std::hash<wasm::Literals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Literals,_std::pair<const_wasm::Literals,_unsigned_int>,_std::allocator<std::pair<const_wasm::Literals,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Literals>,_std::hash<wasm::Literals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&valueNumbering);
  if (endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage != (_Bit_pointer)0x0) {
    operator_delete(endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,
                    (long)values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)endsLiveRange.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void CoalesceLocals::calculateInterferences() {
  interferences.recreate(numLocals);

  // We will track the values in each local, using a numbering where each index
  // represents a unique different value. This array maps a local index to the
  // value index it contains.
  //
  // To avoid reallocating this array all the time, allocate it once outside the
  // loop.
  std::vector<Index> values(numLocals);

  ValueNumbering valueNumbering;

  auto* func = getFunction();

  for (auto& curr : basicBlocks) {
    if (liveBlocks.count(curr.get()) == 0) {
      continue; // ignore dead blocks
    }

    // First, find which gets end a live range. While doing so, also calculate
    // the effectiveness of sets.
    auto& actions = curr->contents.actions;
    std::vector<bool> endsLiveRange(actions.size(), false);
    auto live = curr->contents.end;
    for (int i = int(actions.size()) - 1; i >= 0; i--) {
      auto& action = actions[i];
      auto index = action.index;
      if (action.isGet()) {
        if (!live.has(index)) {
          // The local is not live after us, so its liveness ends here.
          endsLiveRange[i] = true;
          live.insert(index);
        }
      } else {
        // This is a set. Check if the local is alive after it; if it is then
        // the set if effective as there is some get that can read the value.
        if (live.erase(index)) {
          action.effective = true;
        }
      }
    }

    // We have processed from the end of the block to the start, updating |live|
    // as we go, and now it must be equal to the state at the start of the
    // block. We will also use |live| in the next loop, and assume it begins
    // in that state.
    assert(live == curr->contents.start);

    // Now that we know live ranges, check if locals interfere in this block.
    // Locals interfere if they might contain different values on areas where
    // their live ranges overlap. To evaluate that, we do an analysis inside
    // the block that gives each set a unique value number, and as those flow
    // around through copies between sets we can see when sets are guaranteed to
    // be equal.

    if (curr.get() == entry) {
      // Each parameter is assumed to have a different value on entry.
      for (Index i = 0; i < func->getNumParams(); i++) {
        values[i] = valueNumbering.getUniqueValue();
      }

      for (Index i = func->getNumParams(); i < func->getNumLocals(); i++) {
        auto type = func->getLocalType(i);
        if (!LiteralUtils::canMakeZero(type)) {
          // The default value for a type for which we can't make a zero cannot
          // be used anyhow, but we must give it some value in this analysis. A
          // unique one seems least likely to result in surprise during
          // debugging.
          values[i] = valueNumbering.getUniqueValue();
        } else {
          values[i] = valueNumbering.getValue(Literal::makeZeros(type));
        }
      }
    } else {
      // In any block but the entry, assume that each live local might have a
      // different value at the start.
      // TODO: Propagating value IDs across blocks could identify more copies,
      //       however, it would also be nonlinear.
      for (auto index : curr->contents.start) {
        values[index] = valueNumbering.getUniqueValue();
      }
    }

    // Traverse through the block from start to finish. We keep track of both
    // liveness (in |live|) and the value IDs in each local (in |values|)
    // while doing so.
    for (Index i = 0; i < actions.size(); i++) {
      auto& action = actions[i];
      auto index = action.index;
      if (action.isGet()) {
        if (endsLiveRange[i]) {
          [[maybe_unused]] bool erased = live.erase(action.index);
          assert(erased);
        }
        continue;
      }

      // This is a set. Find the value being assigned to the local.
      auto* set = (*action.origin)->cast<LocalSet>();
      Index newValue;
      if (set->value->is<LocalGet>() || set->value->is<LocalSet>()) {
        // This is a copy: Either it is a get or a tee, that occurs right
        // before us. Set our new value to theirs.
        assert(i > 0 && set->value == *actions[i - 1].origin);
        newValue = values[actions[i - 1].index];
      } else {
        // This is not a copy.
        newValue = valueNumbering.getValue(set->value);
      }
      values[index] = newValue;

      // If this set has no gets that read from it, then it does not start a
      // live range, and it cannot cause interference.
      if (!action.effective) {
        continue;
      }

      // Update interferences: This will interfere with any other local that
      // is currently live and contains a different value.
      for (auto other : live) {
        // This index cannot have been live before this set (as we would be
        // trampling some other set before us, if so; and then that set would
        // have been ineffective). We will mark this index as live right after
        // this loop).
        assert(other != index);
        if (values[other] != newValue) {
          interfere(other, index);
        }
      }
      live.insert(action.index);
    }

    // Note that we do not need to do anything for merges: while in general an
    // interference can happen either in a block or when control flow merges,
    // in wasm we have default values for all locals. As a result, if a local is
    // live at the beginning of a block, it will be live at the ends of *all*
    // the blocks reaching it: there is no possibility of an "unset local." That
    // is, imagine we have this merge with a conflict:
    //
    //  [a is set to some value] ->-
    //                              |
    //                              |->- [merge block where a and b are used]
    //                              |
    //  [b is set to some value] ->-
    //
    // It is true that a conflict happens in the merge block, and if we had
    // unset locals then the top block would have b unset, and the bottom block
    // would have a unset, and so there would be no conflict there and the
    // problem would only appear in the merge. But in wasm, that a and b are
    // used in the merge block means that they are live at the end of both the
    // top and bottom block, and that liveness will extend all the way back to
    // *some* set of those values, possibly only the zero-initialization at the
    // function start. Therefore a conflict will be noticed in both the top and
    // bottom blocks, and that merge block does not need to reason about merging
    // its inputs. In other words, a conflict will appear in the middle of a
    // block, somewhere, and therefore we leave it to that block to identify,
    // and so blocks only need to reason about their own contents and not what
    // arrives to them.
    //
    // The one exception here is the entry to the function, see below.
  }

  // We must not try to coalesce parameters as they are fixed. Mark them as
  // "interfering" so that we do not need to special-case them later.
  auto numParams = getFunction()->getNumParams();
  for (Index i = 0; i < numParams; i++) {
    for (Index j = i + 1; j < numParams; j++) {
      interfereLowHigh(i, j);
    }
  }

  // We must handle interference between uses of the zero-init value and
  // parameters manually. A zero initialization represents a set (to a default
  // value), and that set would be what alerts us to a conflict, but there is no
  // actual set in the IR since the zero-init value is applied implicitly.
  for (auto i : entry->contents.start) {
    if (i >= numParams) {
      for (Index j = 0; j < numParams; j++) {
        interfereLowHigh(j, i);
      }
    }
  }
}